

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringEq *curr)

{
  bool bVar1;
  Literal *pLVar2;
  element_type *peVar3;
  element_type *peVar4;
  ulong uVar5;
  size_t sVar6;
  bool local_19e;
  bool local_19d;
  Literal local_158;
  long local_140;
  int64_t right_1;
  int64_t left_1;
  SmallVector<wasm::Literal,_1UL> *pSStack_128;
  Index i;
  Literals *rightValues;
  Literals *leftValues;
  undefined1 local_110 [4];
  int32_t result;
  shared_ptr<wasm::GCData> rightData;
  shared_ptr<wasm::GCData> leftData;
  Literal right;
  undefined1 local_90 [8];
  Literal left;
  undefined1 local_68 [8];
  Flow flow;
  StringEq *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    left.type.id._0_4_ = 1;
    goto LAB_002e8310;
  }
  pLVar2 = Flow::getSingleValue((Flow *)local_68);
  ::wasm::Literal::Literal((Literal *)local_90,pLVar2);
  visit((Flow *)&right.type,this,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x20));
  Flow::operator=((Flow *)local_68,(Flow *)&right.type);
  Flow::~Flow((Flow *)&right.type);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    left.type.id._0_4_ = 1;
  }
  else {
    pLVar2 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal
              ((Literal *)
               &leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pLVar2);
    ::wasm::Literal::getGCData();
    ::wasm::Literal::getGCData();
    if (*(int *)(flow.breakTo.super_IString.str._M_str + 0x10) == 0) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
LAB_002e7f4f:
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        local_19e = false;
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
          local_19e = false;
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&rightData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            peVar3 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            local_19e = SmallVector<wasm::Literal,_1UL>::operator==
                                  (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>,
                                   &(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
          }
        }
        local_19d = local_19e;
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
        local_19d = true;
        if (bVar1) goto LAB_002e7f4f;
      }
      leftValues._4_4_ = (uint)local_19d;
    }
    else {
      if (*(int *)(flow.breakTo.super_IString.str._M_str + 0x10) != 1) {
        ::wasm::handle_unreachable
                  ("bad op",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x799);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if ((!bVar1) ||
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110), !bVar1)) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      peVar4 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      rightValues = &peVar4->values;
      peVar4 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_110);
      pSStack_128 = &(peVar4->values).super_SmallVector<wasm::Literal,_1UL>;
      left_1._4_4_ = 0;
      while( true ) {
        uVar5 = (ulong)left_1._4_4_;
        sVar6 = SmallVector<wasm::Literal,_1UL>::size
                          (&rightValues->super_SmallVector<wasm::Literal,_1UL>);
        if ((uVar5 == sVar6) &&
           (uVar5 = (ulong)left_1._4_4_, sVar6 = SmallVector<wasm::Literal,_1UL>::size(pSStack_128),
           uVar5 == sVar6)) {
          leftValues._4_4_ = 0;
          goto LAB_002e8254;
        }
        uVar5 = (ulong)left_1._4_4_;
        sVar6 = SmallVector<wasm::Literal,_1UL>::size
                          (&rightValues->super_SmallVector<wasm::Literal,_1UL>);
        if (uVar5 == sVar6) {
          leftValues._4_4_ = 0xffffffff;
          goto LAB_002e8254;
        }
        uVar5 = (ulong)left_1._4_4_;
        sVar6 = SmallVector<wasm::Literal,_1UL>::size(pSStack_128);
        if (uVar5 == sVar6) {
          leftValues._4_4_ = 1;
          goto LAB_002e8254;
        }
        SmallVector<wasm::Literal,_1UL>::operator[]
                  (&rightValues->super_SmallVector<wasm::Literal,_1UL>,(ulong)left_1._4_4_);
        right_1 = ::wasm::Literal::getInteger();
        SmallVector<wasm::Literal,_1UL>::operator[](pSStack_128,(ulong)left_1._4_4_);
        local_140 = ::wasm::Literal::getInteger();
        if (right_1 < local_140) {
          leftValues._4_4_ = 0xffffffff;
          goto LAB_002e8254;
        }
        if (local_140 < right_1) break;
        left_1._4_4_ = left_1._4_4_ + 1;
      }
      leftValues._4_4_ = 1;
    }
LAB_002e8254:
    wasm::Literal::Literal(&local_158,leftValues._4_4_);
    Flow::Flow(__return_storage_ptr__,&local_158);
    ::wasm::Literal::~Literal(&local_158);
    left.type.id._0_4_ = 1;
    std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_110);
    std::shared_ptr<wasm::GCData>::~shared_ptr
              ((shared_ptr<wasm::GCData> *)
               &rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::wasm::Literal::~Literal
              ((Literal *)
               &leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ::wasm::Literal::~Literal((Literal *)local_90);
LAB_002e8310:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEq(StringEq* curr) {
    NOTE_ENTER("StringEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    int32_t result;
    switch (curr->op) {
      case StringEqEqual: {
        // They are equal if both are null, or both are non-null and equal.
        result =
          (!leftData && !rightData) ||
          (leftData && rightData && leftData->values == rightData->values);
        break;
      }
      case StringEqCompare: {
        if (!leftData || !rightData) {
          trap("null ref");
        }
        auto& leftValues = leftData->values;
        auto& rightValues = rightData->values;
        Index i = 0;
        while (1) {
          if (i == leftValues.size() && i == rightValues.size()) {
            // We reached the end, and they are equal.
            result = 0;
            break;
          } else if (i == leftValues.size()) {
            // The left string is short.
            result = -1;
            break;
          } else if (i == rightValues.size()) {
            result = 1;
            break;
          }
          auto left = leftValues[i].getInteger();
          auto right = rightValues[i].getInteger();
          if (left < right) {
            // The left character is lower.
            result = -1;
            break;
          } else if (left > right) {
            result = 1;
            break;
          } else {
            // Look further.
            i++;
          }
        }
        break;
      }
      default: {
        WASM_UNREACHABLE("bad op");
      }
    }
    return Literal(result);
  }